

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalKdevelopGenerator::CreateNewProjectFile
          (cmGlobalKdevelopGenerator *this,string *outputDir,string *projectDir,string *filename,
          string *executable,string *cmakeFilePattern,string *fileToOpen,string *sessionFilename)

{
  cmGlobalGenerator *pcVar1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  const_reference ppcVar6;
  cmMakefile *this_01;
  reference pbVar7;
  ulong uVar8;
  bool local_63a;
  undefined1 local_610 [8];
  cmGeneratedFileStream devses;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3c0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b8;
  const_iterator dirIt;
  string local_3a8;
  allocator local_381;
  string local_380 [8];
  string primaryLanguage;
  string local_358;
  byte local_334;
  byte local_333;
  byte local_332;
  allocator local_331;
  undefined1 local_330 [4];
  bool enableFortran;
  allocator local_309;
  string local_308;
  byte local_2e1;
  undefined1 local_2e0 [7];
  bool enableCxx;
  byte local_2b9;
  undefined1 local_2b8 [7];
  bool hasCvs;
  byte local_291;
  uint local_290;
  bool hasSvn;
  undefined1 local_280 [8];
  cmGeneratedFileStream fout;
  string *cmakeFilePattern_local;
  string *executable_local;
  string *filename_local;
  string *projectDir_local;
  string *outputDir_local;
  cmGlobalKdevelopGenerator *this_local;
  
  fout._576_8_ = cmakeFilePattern;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_280,pcVar4,false);
  bVar2 = std::ios::operator!((ios *)(local_280 + (long)*(_func_int **)((long)local_280 + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                   projectDir,"/.svn");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar3 = cmsys::SystemTools::FileExists(pcVar4);
    std::__cxx11::string::~string((string *)local_2b8);
    local_291 = bVar3;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                   projectDir,"/CVS");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar3 = cmsys::SystemTools::FileExists(pcVar4);
    std::__cxx11::string::~string((string *)local_2e0);
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    local_2b9 = bVar3;
    std::allocator<char>::allocator();
    local_332 = 0;
    local_333 = 0;
    std::__cxx11::string::string((string *)&local_308,"C",&local_309);
    bVar3 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_308);
    local_63a = true;
    if (!bVar3) {
      pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
      std::allocator<char>::allocator();
      local_332 = 1;
      std::__cxx11::string::string((string *)local_330,"CXX",&local_331);
      local_333 = 1;
      local_63a = cmGlobalGenerator::GetLanguageEnabled(pcVar1,(string *)local_330);
    }
    if ((local_333 & 1) != 0) {
      std::__cxx11::string::~string((string *)local_330);
    }
    if ((local_332 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
    }
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
    local_2e1 = local_63a;
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_358,"Fortran",
               (allocator *)(primaryLanguage.field_2._M_local_buf + 0xf));
    bVar3 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator
              ((allocator<char> *)(primaryLanguage.field_2._M_local_buf + 0xf));
    local_334 = bVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_380,"C++",&local_381);
    std::allocator<char>::~allocator((allocator<char> *)&local_381);
    if (((local_334 & 1) != 0) && ((local_2e1 & 1) == 0)) {
      std::__cxx11::string::operator=(local_380,"Fortran77");
    }
    poVar5 = std::operator<<((ostream *)local_280,
                             "<?xml version = \'1.0\'?>\n<kdevelop>\n  <general>\n  <author></author>\n  <email></email>\n  <version>$VERSION$</version>\n  <projectmanagement>KDevCustomProject</projectmanagement>\n  <primarylanguage>"
                            );
    poVar5 = std::operator<<(poVar5,local_380);
    poVar5 = std::operator<<(poVar5,"</primarylanguage>\n  <ignoreparts/>\n  <projectdirectory>");
    poVar5 = std::operator<<(poVar5,(string *)projectDir);
    std::operator<<(poVar5,"</projectdirectory>\n");
    std::operator<<((ostream *)local_280,"  <absoluteprojectpath>true</absoluteprojectpath>\n");
    std::operator<<((ostream *)local_280,"  <secondaryLanguages>\n");
    if (((local_334 & 1) != 0) && ((local_2e1 & 1) != 0)) {
      std::operator<<((ostream *)local_280,"     <language>Fortran</language>\n");
    }
    if ((local_2e1 & 1) != 0) {
      std::operator<<((ostream *)local_280,"     <language>C</language>\n");
    }
    std::operator<<((ostream *)local_280,"  </secondaryLanguages>\n");
    if ((local_291 & 1) == 0) {
      if ((local_2b9 & 1) != 0) {
        std::operator<<((ostream *)local_280,"  <versioncontrol>kdevcvsservice</versioncontrol>\n");
      }
    }
    else {
      std::operator<<((ostream *)local_280,"  <versioncontrol>kdevsubversion</versioncontrol>\n");
    }
    poVar5 = std::operator<<((ostream *)local_280,
                             "  </general>\n  <kdevcustomproject>\n    <filelistdirectory>");
    poVar5 = std::operator<<(poVar5,(string *)outputDir);
    poVar5 = std::operator<<(poVar5,"</filelistdirectory>\n    <run>\n      <mainprogram>");
    poVar5 = std::operator<<(poVar5,(string *)executable);
    poVar5 = std::operator<<(poVar5,
                             "</mainprogram>\n      <directoryradio>custom</directoryradio>\n      <customdirectory>"
                            );
    poVar5 = std::operator<<(poVar5,(string *)outputDir);
    std::operator<<(poVar5,
                    "</customdirectory>\n      <programargs></programargs>\n      <terminal>false</terminal>\n      <autocompile>true</autocompile>\n      <envvars/>\n    </run>\n    <build>\n      <buildtool>make</buildtool>\n"
                   );
    poVar5 = std::operator<<((ostream *)local_280,"      <builddir>");
    poVar5 = std::operator<<(poVar5,(string *)outputDir);
    std::operator<<(poVar5,"</builddir>\n");
    poVar5 = std::operator<<((ostream *)local_280,
                             "    </build>\n    <make>\n      <abortonerror>false</abortonerror>\n      <numberofjobs>1</numberofjobs>\n      <dontact>false</dontact>\n      <makebin>"
                            );
    this_00 = cmGlobalGenerator::GetLocalGenerators
                        ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (this_00,0);
    this_01 = cmLocalGenerator::GetMakefile(*ppcVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3a8,"CMAKE_MAKE_PROGRAM",(allocator *)((long)&dirIt._M_current + 7))
    ;
    pcVar4 = cmMakefile::GetRequiredDefinition(this_01,&local_3a8);
    poVar5 = std::operator<<(poVar5,pcVar4);
    std::operator<<(poVar5,
                    " </makebin>\n      <selectedenvironment>default</selectedenvironment>\n      <environments>\n        <default>\n          <envvar value=\"1\" name=\"VERBOSE\" />\n          <envvar value=\"1\" name=\"CMAKE_NO_VERBOSE\" />\n        </default>\n      </environments>\n    </make>\n"
                   );
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dirIt._M_current + 7));
    std::operator<<((ostream *)local_280,"    <blacklist>\n");
    local_3c0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->Blacklist);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_3b8,&local_3c0);
    while( true ) {
      devses._576_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->Blacklist);
      bVar3 = __gnu_cxx::operator!=
                        (&local_3b8,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&devses.field_0x240);
      if (!bVar3) break;
      poVar5 = std::operator<<((ostream *)local_280,"      <path>");
      pbVar7 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_3b8);
      poVar5 = std::operator<<(poVar5,(string *)pbVar7);
      std::operator<<(poVar5,"</path>\n");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_3b8);
    }
    std::operator<<((ostream *)local_280,"    </blacklist>\n");
    std::operator<<((ostream *)local_280,
                    "  </kdevcustomproject>\n  <kdevfilecreate>\n    <filetypes/>\n    <useglobaltypes>\n      <type ext=\"ui\" />\n      <type ext=\"cpp\" />\n      <type ext=\"h\" />\n    </useglobaltypes>\n  </kdevfilecreate>\n  <kdevdoctreeview>\n    <projectdoc>\n      <userdocDir>html/</userdocDir>\n      <apidocDir>html/</apidocDir>\n    </projectdoc>\n    <ignoreqt_xml/>\n    <ignoredoxygen/>\n    <ignorekdocs/>\n    <ignoretocs/>\n    <ignoredevhelp/>\n  </kdevdoctreeview>\n"
                   );
    if ((local_2e1 & 1) != 0) {
      std::operator<<((ostream *)local_280,
                      "  <cppsupportpart>\n    <filetemplates>\n      <interfacesuffix>.h</interfacesuffix>\n      <implementationsuffix>.cpp</implementationsuffix>\n    </filetemplates>\n  </cppsupportpart>\n  <kdevcppsupport>\n    <codecompletion>\n      <includeGlobalFunctions>true</includeGlobalFunctions>\n      <includeTypes>true</includeTypes>\n      <includeEnums>true</includeEnums>\n      <includeTypedefs>false</includeTypedefs>\n      <automaticCodeCompletion>true</automaticCodeCompletion>\n      <automaticArgumentsHint>true</automaticArgumentsHint>\n      <automaticHeaderCompletion>true</automaticHeaderCompletion>\n      <codeCompletionDelay>250</codeCompletionDelay>\n      <argumentsHintDelay>400</argumentsHintDelay>\n      <headerCompletionDelay>250</headerCompletionDelay>\n    </codecompletion>\n    <references/>\n  </kdevcppsupport>\n"
                     );
    }
    if ((local_334 & 1) != 0) {
      std::operator<<((ostream *)local_280,
                      "  <kdevfortransupport>\n    <ftnchek>\n      <division>false</division>\n      <extern>false</extern>\n      <declare>false</declare>\n      <pure>false</pure>\n      <argumentsall>false</argumentsall>\n      <commonall>false</commonall>\n      <truncationall>false</truncationall>\n      <usageall>false</usageall>\n      <f77all>false</f77all>\n      <portabilityall>false</portabilityall>\n      <argumentsonly/>\n      <commononly/>\n      <truncationonly/>\n      <usageonly/>\n      <f77only/>\n      <portabilityonly/>\n    </ftnchek>\n  </kdevfortransupport>\n"
                     );
    }
    poVar5 = std::operator<<((ostream *)local_280,
                             "  <kdevfileview>\n    <groups>\n      <group pattern=\"");
    poVar5 = std::operator<<(poVar5,(string *)fout._576_8_);
    std::operator<<(poVar5,"\" name=\"CMake\" />\n");
    if ((local_2e1 & 1) != 0) {
      std::operator<<((ostream *)local_280,
                      "      <group pattern=\"*.h;*.hxx;*.hpp\" name=\"Header\" />\n      <group pattern=\"*.c\" name=\"C Sources\" />\n      <group pattern=\"*.cpp;*.C;*.cxx;*.cc\" name=\"C++ Sources\"/>\n"
                     );
    }
    if ((local_334 & 1) != 0) {
      std::operator<<((ostream *)local_280,
                      "      <group pattern=\"*.f;*.F;*.f77;*.F77;*.f90;*.F90;*.for;*.f95;*.F95\" name=\"Fortran Sources\" />\n"
                     );
    }
    std::operator<<((ostream *)local_280,
                    "      <group pattern=\"*.ui\" name=\"Qt Designer files\" />\n      <hidenonprojectfiles>true</hidenonprojectfiles>\n    </groups>\n    <tree>\n      <hidepatterns>*.o,*.lo,CVS,*~,cmake*</hidepatterns>\n      <hidenonprojectfiles>true</hidenonprojectfiles>\n    </tree>\n  </kdevfileview>\n</kdevelop>\n"
                   );
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_610,pcVar4,false);
      bVar2 = std::ios::operator!((ios *)(local_610 + (long)*(_func_int **)((long)local_610 + -0x18)
                                         ));
      bVar3 = (bVar2 & 1) != 0;
      if (!bVar3) {
        poVar5 = std::operator<<((ostream *)local_610,
                                 "<?xml version = \'1.0\' encoding = \'UTF-8\'?>\n<!DOCTYPE KDevPrjSession>\n<KDevPrjSession>\n <DocsAndViews NumberOfDocuments=\"1\" >\n  <Doc0 NumberOfViews=\"1\" URL=\"file://"
                                );
        poVar5 = std::operator<<(poVar5,(string *)fileToOpen);
        std::operator<<(poVar5,
                        "\" >\n   <View0 line=\"0\" Type=\"Source\" />\n  </Doc0>\n </DocsAndViews>\n</KDevPrjSession>\n"
                       );
      }
      local_290 = (uint)bVar3;
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_610);
    }
    else {
      local_290 = 1;
    }
    std::__cxx11::string::~string(local_380);
  }
  else {
    local_290 = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_280);
  return;
}

Assistant:

void cmGlobalKdevelopGenerator
::CreateNewProjectFile(const std::string& outputDir,
                       const std::string& projectDir,
                       const std::string& filename,
                       const std::string& executable,
                       const std::string& cmakeFilePattern,
                       const std::string& fileToOpen,
                       const std::string& sessionFilename)
{
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  // check for a version control system
  bool hasSvn = cmSystemTools::FileExists((projectDir + "/.svn").c_str());
  bool hasCvs = cmSystemTools::FileExists((projectDir + "/CVS").c_str());

  bool enableCxx = (this->GlobalGenerator->GetLanguageEnabled("C")
                          || this->GlobalGenerator->GetLanguageEnabled("CXX"));
  bool enableFortran = this->GlobalGenerator->GetLanguageEnabled("Fortran");
  std::string primaryLanguage = "C++";
  if (enableFortran && !enableCxx)
    {
    primaryLanguage="Fortran77";
    }

  fout<<"<?xml version = '1.0'?>\n"
        "<kdevelop>\n"
        "  <general>\n"
        "  <author></author>\n"
        "  <email></email>\n"
        "  <version>$VERSION$</version>\n"
        "  <projectmanagement>KDevCustomProject</projectmanagement>\n"
        "  <primarylanguage>" << primaryLanguage << "</primarylanguage>\n"
        "  <ignoreparts/>\n"
        "  <projectdirectory>" << projectDir <<
        "</projectdirectory>\n";   //this one is important
  fout<<"  <absoluteprojectpath>true</absoluteprojectpath>\n"; //and this one

  // setup additional languages
  fout<<"  <secondaryLanguages>\n";
  if (enableFortran && enableCxx)
    {
    fout<<"     <language>Fortran</language>\n";
    }
  if (enableCxx)
    {
    fout<<"     <language>C</language>\n";
    }
  fout<<"  </secondaryLanguages>\n";

  if (hasSvn)
    {
    fout << "  <versioncontrol>kdevsubversion</versioncontrol>\n";
    }
  else if (hasCvs)
    {
    fout << "  <versioncontrol>kdevcvsservice</versioncontrol>\n";
    }

  fout<<"  </general>\n"
        "  <kdevcustomproject>\n"
        "    <filelistdirectory>" << outputDir <<
        "</filelistdirectory>\n"
        "    <run>\n"
        "      <mainprogram>" << executable << "</mainprogram>\n"
        "      <directoryradio>custom</directoryradio>\n"
        "      <customdirectory>"<<outputDir<<"</customdirectory>\n"
        "      <programargs></programargs>\n"
        "      <terminal>false</terminal>\n"
        "      <autocompile>true</autocompile>\n"
        "      <envvars/>\n"
        "    </run>\n"
        "    <build>\n"
        "      <buildtool>make</buildtool>\n"; //this one is important
  fout<<"      <builddir>"<<outputDir<<"</builddir>\n";  //and this one
  fout<<"    </build>\n"
        "    <make>\n"
        "      <abortonerror>false</abortonerror>\n"
        "      <numberofjobs>1</numberofjobs>\n"
        "      <dontact>false</dontact>\n"
        "      <makebin>" << this->GlobalGenerator->GetLocalGenerators()[0]->
            GetMakefile()->GetRequiredDefinition("CMAKE_MAKE_PROGRAM")
            << " </makebin>\n"
        "      <selectedenvironment>default</selectedenvironment>\n"
        "      <environments>\n"
        "        <default>\n"
        "          <envvar value=\"1\" name=\"VERBOSE\" />\n"
        "          <envvar value=\"1\" name=\"CMAKE_NO_VERBOSE\" />\n"
        "        </default>\n"
        "      </environments>\n"
        "    </make>\n";

  fout<<"    <blacklist>\n";
  for(std::vector<std::string>::const_iterator dirIt=this->Blacklist.begin();
      dirIt != this->Blacklist.end();
      ++dirIt)
    {
    fout<<"      <path>" << *dirIt << "</path>\n";
    }
  fout<<"    </blacklist>\n";

  fout<<"  </kdevcustomproject>\n"
        "  <kdevfilecreate>\n"
        "    <filetypes/>\n"
        "    <useglobaltypes>\n"
        "      <type ext=\"ui\" />\n"
        "      <type ext=\"cpp\" />\n"
        "      <type ext=\"h\" />\n"
        "    </useglobaltypes>\n"
        "  </kdevfilecreate>\n"
        "  <kdevdoctreeview>\n"
        "    <projectdoc>\n"
        "      <userdocDir>html/</userdocDir>\n"
        "      <apidocDir>html/</apidocDir>\n"
        "    </projectdoc>\n"
        "    <ignoreqt_xml/>\n"
        "    <ignoredoxygen/>\n"
        "    <ignorekdocs/>\n"
        "    <ignoretocs/>\n"
        "    <ignoredevhelp/>\n"
        "  </kdevdoctreeview>\n";

  if (enableCxx)
    {
    fout<<"  <cppsupportpart>\n"
          "    <filetemplates>\n"
          "      <interfacesuffix>.h</interfacesuffix>\n"
          "      <implementationsuffix>.cpp</implementationsuffix>\n"
          "    </filetemplates>\n"
          "  </cppsupportpart>\n"
          "  <kdevcppsupport>\n"
          "    <codecompletion>\n"
          "      <includeGlobalFunctions>true</includeGlobalFunctions>\n"
          "      <includeTypes>true</includeTypes>\n"
          "      <includeEnums>true</includeEnums>\n"
          "      <includeTypedefs>false</includeTypedefs>\n"
          "      <automaticCodeCompletion>true</automaticCodeCompletion>\n"
          "      <automaticArgumentsHint>true</automaticArgumentsHint>\n"
          "      <automaticHeaderCompletion>true</automaticHeaderCompletion>\n"
          "      <codeCompletionDelay>250</codeCompletionDelay>\n"
          "      <argumentsHintDelay>400</argumentsHintDelay>\n"
          "      <headerCompletionDelay>250</headerCompletionDelay>\n"
          "    </codecompletion>\n"
          "    <references/>\n"
          "  </kdevcppsupport>\n";
    }

  if (enableFortran)
    {
    fout<<"  <kdevfortransupport>\n"
          "    <ftnchek>\n"
          "      <division>false</division>\n"
          "      <extern>false</extern>\n"
          "      <declare>false</declare>\n"
          "      <pure>false</pure>\n"
          "      <argumentsall>false</argumentsall>\n"
          "      <commonall>false</commonall>\n"
          "      <truncationall>false</truncationall>\n"
          "      <usageall>false</usageall>\n"
          "      <f77all>false</f77all>\n"
          "      <portabilityall>false</portabilityall>\n"
          "      <argumentsonly/>\n"
          "      <commononly/>\n"
          "      <truncationonly/>\n"
          "      <usageonly/>\n"
          "      <f77only/>\n"
          "      <portabilityonly/>\n"
          "    </ftnchek>\n"
          "  </kdevfortransupport>\n";
    }

  // set up file groups. maybe this can be used with the CMake SOURCE_GROUP()
  // command
  fout<<"  <kdevfileview>\n"
        "    <groups>\n"
        "      <group pattern=\"" << cmakeFilePattern <<
        "\" name=\"CMake\" />\n";

  if (enableCxx)
    {
    fout<<"      <group pattern=\"*.h;*.hxx;*.hpp\" name=\"Header\" />\n"
          "      <group pattern=\"*.c\" name=\"C Sources\" />\n"
          "      <group pattern=\"*.cpp;*.C;*.cxx;*.cc\" name=\"C++ Sources\""
          "/>\n";
    }

  if (enableFortran)
    {
    fout<<"      <group pattern=\"*.f;*.F;*.f77;*.F77;*.f90;*.F90;*.for;*.f95;"
          "*.F95\" name=\"Fortran Sources\" />\n";
    }

  fout<<"      <group pattern=\"*.ui\" name=\"Qt Designer files\" />\n"
        "      <hidenonprojectfiles>true</hidenonprojectfiles>\n"
        "    </groups>\n"
        "    <tree>\n"
        "      <hidepatterns>*.o,*.lo,CVS,*~,cmake*</hidepatterns>\n"
        "      <hidenonprojectfiles>true</hidenonprojectfiles>\n"
        "    </tree>\n"
        "  </kdevfileview>\n"
        "</kdevelop>\n";

  if (sessionFilename.empty())
    {
    return;
    }

  // and a session file, so that kdevelop opens a file if it opens the
  // project the first time
  cmGeneratedFileStream devses(sessionFilename.c_str());
  if(!devses)
    {
    return;
    }
  devses<<"<?xml version = '1.0' encoding = \'UTF-8\'?>\n"
          "<!DOCTYPE KDevPrjSession>\n"
          "<KDevPrjSession>\n"
          " <DocsAndViews NumberOfDocuments=\"1\" >\n"
          "  <Doc0 NumberOfViews=\"1\" URL=\"file://" << fileToOpen <<
          "\" >\n"
          "   <View0 line=\"0\" Type=\"Source\" />\n"
          "  </Doc0>\n"
          " </DocsAndViews>\n"
          "</KDevPrjSession>\n";
}